

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::UnknownFieldParserHelper::ParseGroup
          (UnknownFieldParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  UnknownFieldSet *unknown;
  char *pcVar4;
  LogMessage *pLVar5;
  UnknownFieldParserHelper *local_c8;
  long local_c0;
  ParseContext **local_b8;
  ParseContext *local_b0;
  ParseContext *ctx_local;
  char *ptr_local;
  UnknownFieldParserHelper *pUStack_98;
  uint32_t num_local;
  UnknownFieldParserHelper *this_local;
  Voidify local_79;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_59;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint32_t local_3c;
  char *local_38;
  ParseContext *local_30;
  char *local_28;
  UnknownFieldParserHelper local_20;
  UnknownFieldParserHelper child;
  
  iVar3 = ptr_local._4_4_;
  local_3c = num * 8 + 3;
  local_c0 = (long)&ptr_local + 4;
  local_b8 = &local_b0;
  _old_group_depth = &local_c8;
  iVar2 = ctx->depth_ + -1;
  ctx->depth_ = iVar2;
  if (iVar2 < 0) {
    local_28 = (char *)0x0;
  }
  else {
    ctx->group_depth_ = ctx->group_depth_ + 1;
    absl_log_internal_check_op_result._4_4_ = ctx->depth_;
    absl_log_internal_check_op_result._0_4_ = ctx->group_depth_;
    local_c8 = this;
    local_b0 = ctx;
    ctx_local = (ParseContext *)ptr;
    ptr_local._4_4_ = num;
    pUStack_98 = this;
    local_38 = ptr;
    local_30 = ctx;
    child.unknown_ = (UnknownFieldSet *)ptr;
    unknown = UnknownFieldSet::AddGroup(this->unknown_,iVar3);
    UnknownFieldParserHelper(&local_20,unknown);
    local_38 = WireFormatParser<google::protobuf::internal::UnknownFieldParserHelper>
                         (&local_20,(char *)child.unknown_,*local_b8);
    if (local_38 != (char *)0x0) {
      iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result._4_4_);
      iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(ctx->depth_);
      local_58 = absl::lts_20250127::log_internal::Check_EQImpl(iVar3,iVar2,"old_depth == depth_");
      if (local_58 != (Nullable<const_char_*>)0x0) {
        pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_58);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x491,pcVar4);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&absl_log_internal_check_op_result_1);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_59,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
      }
      iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue
                        ((int)absl_log_internal_check_op_result);
      iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(ctx->group_depth_);
      local_78 = absl::lts_20250127::log_internal::Check_EQImpl
                           (iVar3,iVar2,"old_group_depth == group_depth_");
      if (local_78 != (Nullable<const_char_*>)0x0) {
        pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_78);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&this_local,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x492,pcVar4);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&this_local);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&this_local);
      }
      local_78 = (Nullable<const_char_*>)0x0;
    }
    ctx->group_depth_ = ctx->group_depth_ + -1;
    ctx->depth_ = ctx->depth_ + 1;
    bVar1 = EpsCopyInputStream::ConsumeEndGroup(&ctx->super_EpsCopyInputStream,local_3c);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_28 = local_38;
    }
    else {
      local_28 = (char *)0x0;
    }
  }
  return local_28;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    return ctx->ParseGroupInlined(ptr, num * 8 + 3, [&](const char* ptr) {
      UnknownFieldParserHelper child(unknown_->AddGroup(num));
      return WireFormatParser(child, ptr, ctx);
    });
  }